

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlParser.cpp
# Opt level: O3

char * __thiscall XMLParser::ToXMLStringTool::toXML(ToXMLStringTool *this,char *source)

{
  int iVar1;
  char *dest;
  undefined1 *puVar2;
  
  if (source == (char *)0x0) {
    if (*(int *)(this + 8) < 1) {
      *(undefined4 *)(this + 8) = 1;
      puVar2 = (undefined1 *)malloc(1);
      *(undefined1 **)this = puVar2;
    }
    else {
      puVar2 = *(undefined1 **)this;
    }
    *puVar2 = 0;
    dest = *(char **)this;
  }
  else {
    iVar1 = lengthXMLString(source);
    dest = *(char **)this;
    if (*(int *)(this + 8) <= iVar1) {
      if (dest != (char *)0x0) {
        free(dest);
      }
      *(int *)(this + 8) = iVar1 + 1;
      dest = (char *)malloc((long)(iVar1 + 1));
      *(char **)this = dest;
    }
    toXMLUnSafe(dest,source);
  }
  return dest;
}

Assistant:

XMLSTR ToXMLStringTool::toXML(XMLCSTR source)
    {
        if(!source)
        {
            if(buflen < 1)
            {
                buflen = 1;
                buf = (XMLSTR)malloc(sizeof(XMLCHAR));
            }
            *buf = 0;
            return buf;
        }
        int l = lengthXMLString(source) + 1;
        if(l > buflen)
        {
            freeBuffer();
            buflen = l;
            buf = (XMLSTR)malloc(l * sizeof(XMLCHAR));
        }
        return toXMLUnSafe(buf, source);
    }